

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

bool __thiscall cppcms::widgets::select_multiple::validate(select_multiple *this)

{
  pointer peVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  peVar1 = (this->elements_).
           super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  for (uVar4 = 0;
      (ulong)uVar4 <
      (ulong)(((long)(this->elements_).
                     super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1) / 200);
      uVar4 = uVar4 + 1) {
    uVar3 = uVar3 + (*(uint *)(peVar1 + uVar4) & 1);
  }
  bVar2 = uVar3 <= this->high_ && this->low_ <= uVar3;
  *(uint *)&(this->super_base_widget).field_0x1f0 =
       *(uint *)&(this->super_base_widget).field_0x1f0 & 0xfffffffe | (uint)bVar2;
  return bVar2;
}

Assistant:

bool select_multiple::validate()
{
	unsigned count=0;
	for(unsigned i=0;i<elements_.size();i++)
		count += elements_[i].selected;
	if(low_ <= count && count <= high_) {
		valid(true);
		return true;
	}
	else {
		valid(false);
		return false;
	}
}